

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__gif_load_next(stbi__context *s,stbi__gif *g,int *comp,int req_comp,stbi_uc *two_back
                             )

{
  bool bVar1;
  stbi_uc sVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  stbi_uc *psVar8;
  int local_8c;
  int ext;
  int len;
  stbi_uc *o;
  stbi__int32 h;
  stbi__int32 w;
  stbi__int32 y;
  stbi__int32 x;
  int tag;
  int pcount;
  int pi;
  int first_frame;
  int dispose;
  stbi_uc *two_back_local;
  int req_comp_local;
  int *comp_local;
  stbi__gif *g_local;
  stbi__context *s_local;
  
  bVar1 = false;
  if (g->out == (stbi_uc *)0x0) {
    iVar4 = stbi__gif_header(s,g,comp,0);
    if (iVar4 == 0) {
      return (stbi_uc *)0x0;
    }
    iVar4 = stbi__mad3sizes_valid(4,g->w,g->h,0);
    if (iVar4 == 0) {
      stbi__err("too large");
      return (stbi_uc *)0x0;
    }
    iVar4 = g->w * g->h;
    psVar8 = (stbi_uc *)stbi__malloc((long)(iVar4 * 4));
    g->out = psVar8;
    psVar8 = (stbi_uc *)stbi__malloc((long)(iVar4 * 4));
    g->background = psVar8;
    psVar8 = (stbi_uc *)stbi__malloc((long)iVar4);
    g->history = psVar8;
    if (((g->out == (stbi_uc *)0x0) || (g->background == (stbi_uc *)0x0)) ||
       (g->history == (stbi_uc *)0x0)) {
      stbi__err("outofmem");
      return (stbi_uc *)0x0;
    }
    memset(g->out,0,(long)(iVar4 * 4));
    memset(g->background,0,(long)(iVar4 * 4));
    memset(g->history,0,(long)iVar4);
    bVar1 = true;
  }
  else {
    pi = (int)(g->eflags & 0x1cU) >> 2;
    iVar4 = g->w * g->h;
    if ((pi == 3) && (two_back == (stbi_uc *)0x0)) {
      pi = 2;
    }
    if (pi == 3) {
      for (tag = 0; tag < iVar4; tag = tag + 1) {
        if (g->history[tag] != '\0') {
          *(undefined4 *)(g->out + (tag << 2)) = *(undefined4 *)(two_back + (tag << 2));
        }
      }
    }
    else if (pi == 2) {
      for (tag = 0; tag < iVar4; tag = tag + 1) {
        if (g->history[tag] != '\0') {
          *(undefined4 *)(g->out + (tag << 2)) = *(undefined4 *)(g->background + (tag << 2));
        }
      }
    }
    memcpy(g->background,g->out,(long)(g->w * 4 * g->h));
  }
  memset(g->history,0,(long)(g->w * g->h));
  do {
    while( true ) {
      sVar2 = stbi__get8(s);
      if (sVar2 != '!') {
        if (sVar2 == ',') {
          iVar4 = stbi__get16le(s);
          iVar5 = stbi__get16le(s);
          iVar6 = stbi__get16le(s);
          iVar7 = stbi__get16le(s);
          if ((g->w < iVar4 + iVar6) || (g->h < iVar5 + iVar7)) {
            stbi__err("bad Image Descriptor");
            s_local = (stbi__context *)0x0;
          }
          else {
            g->line_size = g->w << 2;
            g->start_x = iVar4 << 2;
            g->start_y = iVar5 * g->line_size;
            g->max_x = g->start_x + iVar6 * 4;
            g->max_y = g->start_y + iVar7 * g->line_size;
            g->cur_x = g->start_x;
            g->cur_y = g->start_y;
            if (iVar6 == 0) {
              g->cur_y = g->max_y;
            }
            bVar3 = stbi__get8(s);
            g->lflags = (uint)bVar3;
            if ((g->lflags & 0x40U) == 0) {
              g->step = g->line_size;
              g->parse = 0;
            }
            else {
              g->step = g->line_size << 3;
              g->parse = 3;
            }
            if ((g->lflags & 0x80U) == 0) {
              if ((g->flags & 0x80U) == 0) {
                stbi__err("missing color table");
                return (stbi_uc *)0x0;
              }
              g->color_table = g->pal[0];
            }
            else {
              if ((g->eflags & 1U) == 0) {
                local_8c = -1;
              }
              else {
                local_8c = g->transparent;
              }
              stbi__gif_parse_colortable(s,g->lpal,2 << ((byte)g->lflags & 7),local_8c);
              g->color_table = g->lpal[0];
            }
            s_local = (stbi__context *)stbi__process_gif_raster(s,g);
            if (s_local == (stbi__context *)0x0) {
              s_local = (stbi__context *)0x0;
            }
            else {
              iVar4 = g->w;
              iVar5 = g->h;
              if ((bVar1) && (0 < g->bgindex)) {
                for (tag = 0; tag < iVar4 * iVar5; tag = tag + 1) {
                  if (g->history[tag] == '\0') {
                    g->pal[g->bgindex][3] = 0xff;
                    *(stbi_uc (*) [4])(g->out + (tag << 2)) = g->pal[g->bgindex];
                  }
                }
              }
            }
          }
        }
        else {
          s_local = s;
          if (sVar2 != ';') {
            stbi__err("unknown code");
            s_local = (stbi__context *)0x0;
          }
        }
        return (stbi_uc *)s_local;
      }
      sVar2 = stbi__get8(s);
      if (sVar2 == 0xf9) break;
LAB_001b54d4:
      while( true ) {
        bVar3 = stbi__get8(s);
        if (bVar3 == 0) break;
        stbi__skip(s,(uint)bVar3);
      }
    }
    bVar3 = stbi__get8(s);
    if (bVar3 == 4) {
      bVar3 = stbi__get8(s);
      g->eflags = (uint)bVar3;
      iVar4 = stbi__get16le(s);
      g->delay = iVar4 * 10;
      if (-1 < g->transparent) {
        g->pal[g->transparent][3] = 0xff;
      }
      if ((g->eflags & 1U) == 0) {
        stbi__skip(s,1);
        g->transparent = -1;
      }
      else {
        bVar3 = stbi__get8(s);
        g->transparent = (uint)bVar3;
        if (-1 < g->transparent) {
          g->pal[g->transparent][3] = '\0';
        }
      }
      goto LAB_001b54d4;
    }
    stbi__skip(s,(uint)bVar3);
  } while( true );
}

Assistant:

static stbi_uc *stbi__gif_load_next(stbi__context *s, stbi__gif *g, int *comp, int req_comp, stbi_uc *two_back)
{
   int dispose; 
   int first_frame; 
   int pi; 
   int pcount; 
   STBI_NOTUSED(req_comp);

   // on first frame, any non-written pixels get the background colour (non-transparent)
   first_frame = 0; 
   if (g->out == 0) {
      if (!stbi__gif_header(s, g, comp,0)) return 0; // stbi__g_failure_reason set by stbi__gif_header
      if (!stbi__mad3sizes_valid(4, g->w, g->h, 0))
         return stbi__errpuc("too large", "GIF image is too large");
      pcount = g->w * g->h;
      g->out = (stbi_uc *) stbi__malloc(4 * pcount);
      g->background = (stbi_uc *) stbi__malloc(4 * pcount);
      g->history = (stbi_uc *) stbi__malloc(pcount);
      if (!g->out || !g->background || !g->history)
         return stbi__errpuc("outofmem", "Out of memory");

      // image is treated as "transparent" at the start - ie, nothing overwrites the current background; 
      // background colour is only used for pixels that are not rendered first frame, after that "background"
      // color refers to the color that was there the previous frame. 
      memset(g->out, 0x00, 4 * pcount);
      memset(g->background, 0x00, 4 * pcount); // state of the background (starts transparent)
      memset(g->history, 0x00, pcount);        // pixels that were affected previous frame
      first_frame = 1; 
   } else {
      // second frame - how do we dispoase of the previous one?
      dispose = (g->eflags & 0x1C) >> 2; 
      pcount = g->w * g->h; 

      if ((dispose == 3) && (two_back == 0)) {
         dispose = 2; // if I don't have an image to revert back to, default to the old background
      }

      if (dispose == 3) { // use previous graphic
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &two_back[pi * 4], 4 ); 
            }
         }
      } else if (dispose == 2) { 
         // restore what was changed last frame to background before that frame; 
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &g->background[pi * 4], 4 ); 
            }
         }
      } else {
         // This is a non-disposal case eithe way, so just 
         // leave the pixels as is, and they will become the new background
         // 1: do not dispose
         // 0:  not specified.
      }

      // background is what out is after the undoing of the previou frame; 
      memcpy( g->background, g->out, 4 * g->w * g->h ); 
   }

   // clear my history; 
   memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame

   for (;;) {
      int tag = stbi__get8(s); 
      switch (tag) {
         case 0x2C: /* Image Descriptor */
         {
            stbi__int32 x, y, w, h;
            stbi_uc *o;

            x = stbi__get16le(s);
            y = stbi__get16le(s);
            w = stbi__get16le(s);
            h = stbi__get16le(s);
            if (((x + w) > (g->w)) || ((y + h) > (g->h)))
               return stbi__errpuc("bad Image Descriptor", "Corrupt GIF");

            g->line_size = g->w * 4;
            g->start_x = x * 4;
            g->start_y = y * g->line_size;
            g->max_x   = g->start_x + w * 4;
            g->max_y   = g->start_y + h * g->line_size;
            g->cur_x   = g->start_x;
            g->cur_y   = g->start_y;

            // if the width of the specified rectangle is 0, that means
            // we may not see *any* pixels or the image is malformed;
            // to make sure this is caught, move the current y down to
            // max_y (which is what out_gif_code checks).
            if (w == 0)
               g->cur_y = g->max_y;

            g->lflags = stbi__get8(s);

            if (g->lflags & 0x40) {
               g->step = 8 * g->line_size; // first interlaced spacing
               g->parse = 3;
            } else {
               g->step = g->line_size;
               g->parse = 0;
            }

            if (g->lflags & 0x80) {
               stbi__gif_parse_colortable(s,g->lpal, 2 << (g->lflags & 7), g->eflags & 0x01 ? g->transparent : -1);
               g->color_table = (stbi_uc *) g->lpal;
            } else if (g->flags & 0x80) {
               g->color_table = (stbi_uc *) g->pal;
            } else
               return stbi__errpuc("missing color table", "Corrupt GIF");            
            
            o = stbi__process_gif_raster(s, g);
            if (!o) return NULL;

            // if this was the first frame, 
            pcount = g->w * g->h; 
            if (first_frame && (g->bgindex > 0)) {
               // if first frame, any pixel not drawn to gets the background color
               for (pi = 0; pi < pcount; ++pi) {
                  if (g->history[pi] == 0) {
                     g->pal[g->bgindex][3] = 255; // just in case it was made transparent, undo that; It will be reset next frame if need be; 
                     memcpy( &g->out[pi * 4], &g->pal[g->bgindex], 4 ); 
                  }
               }
            }

            return o;
         }

         case 0x21: // Comment Extension.
         {
            int len;
            int ext = stbi__get8(s); 
            if (ext == 0xF9) { // Graphic Control Extension.
               len = stbi__get8(s);
               if (len == 4) {
                  g->eflags = stbi__get8(s);
                  g->delay = 10 * stbi__get16le(s); // delay - 1/100th of a second, saving as 1/1000ths.

                  // unset old transparent
                  if (g->transparent >= 0) {
                     g->pal[g->transparent][3] = 255; 
                  } 
                  if (g->eflags & 0x01) {
                     g->transparent = stbi__get8(s);
                     if (g->transparent >= 0) {
                        g->pal[g->transparent][3] = 0; 
                     }
                  } else {
                     // don't need transparent
                     stbi__skip(s, 1); 
                     g->transparent = -1; 
                  }
               } else {
                  stbi__skip(s, len);
                  break;
               }
            } 
            while ((len = stbi__get8(s)) != 0) {
               stbi__skip(s, len);
            }
            break;
         }

         case 0x3B: // gif stream termination code
            return (stbi_uc *) s; // using '1' causes warning on some compilers

         default:
            return stbi__errpuc("unknown code", "Corrupt GIF");
      }
   }
}